

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void first_valueFinalizeFunc(sqlite3_context *pCtx)

{
  char *pcVar1;
  
  if ((pCtx->pMem->flags & 0x2000) == 0) {
    pcVar1 = (char *)createAggContext(pCtx,0x10);
  }
  else {
    pcVar1 = pCtx->pMem->z;
  }
  if ((pcVar1 != (char *)0x0) && (*(Mem **)(pcVar1 + 8) != (Mem *)0x0)) {
    sqlite3VdbeMemCopy(pCtx->pOut,*(Mem **)(pcVar1 + 8));
    sqlite3ValueFree(*(sqlite3_value **)(pcVar1 + 8));
    pcVar1[8] = '\0';
    pcVar1[9] = '\0';
    pcVar1[10] = '\0';
    pcVar1[0xb] = '\0';
    pcVar1[0xc] = '\0';
    pcVar1[0xd] = '\0';
    pcVar1[0xe] = '\0';
    pcVar1[0xf] = '\0';
  }
  return;
}

Assistant:

static void first_valueFinalizeFunc(sqlite3_context *pCtx){
  struct NthValueCtx *p;
  p = (struct NthValueCtx*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p && p->pValue ){
    sqlite3_result_value(pCtx, p->pValue);
    sqlite3_value_free(p->pValue);
    p->pValue = 0;
  }
}